

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

string * fs_drop_slash_abi_cxx11_(string *__return_storage_ptr__,string_view in)

{
  ulong uVar1;
  size_t __n;
  pointer pcVar2;
  size_type sVar3;
  _Bool _Var4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  undefined1 in_stack_00000008 [16];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  fs_as_posix_abi_cxx11_(__return_storage_ptr__,in);
  uVar1 = __return_storage_ptr__->_M_string_length;
  while ((1 < uVar1 && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar1 - 1] == '/'))) {
    std::__cxx11::string::pop_back();
    uVar1 = __return_storage_ptr__->_M_string_length;
  }
  _Var4 = fs_is_windows();
  bVar10 = in._M_len != 0;
  if (_Var4 && bVar10) {
    fs_root_name_abi_cxx11_((string_view)in_stack_00000008);
    __n = __return_storage_ptr__->_M_string_length;
    if (__n == local_38) {
      if (__n == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,local_40,__n);
        bVar11 = iVar5 == 0;
      }
      goto LAB_0011e5e9;
    }
  }
  bVar11 = false;
LAB_0011e5e9:
  if ((_Var4 && bVar10) && (local_40 != local_30)) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (bVar11) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar3 = __return_storage_ptr__->_M_string_length;
  pcVar7 = pcVar2 + sVar3;
  pcVar6 = pcVar7;
  if (sVar3 != 0) {
    lVar8 = sVar3 - 1;
    pcVar6 = pcVar2 + -1;
    do {
      pcVar9 = pcVar6;
      pcVar6 = pcVar7;
      if (lVar8 == 0) break;
      pcVar6 = pcVar9 + 1;
      lVar8 = lVar8 + -1;
    } while ((pcVar9[1] != '/') || (pcVar9[2] != '/'));
  }
  if (pcVar6 != pcVar7) {
    for (pcVar9 = pcVar6 + 2; pcVar9 != pcVar7; pcVar9 = pcVar9 + 1) {
      if (*pcVar9 != '/' || *pcVar6 != '/') {
        pcVar6[1] = *pcVar9;
        pcVar6 = pcVar6 + 1;
      }
    }
    pcVar7 = pcVar6 + 1;
  }
  __return_storage_ptr__->_M_string_length =
       (long)pcVar7 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *pcVar7 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_drop_slash(std::string_view in)
{
  // drop all trailing "/" and duplicated internal "/"
  std::string s = fs_as_posix(in);

  while(s.length() > 1 && s.back() == '/')
    s.pop_back();

  if (fs_is_windows() && !in.empty() && s == fs_root_name(in))
    s.append("/");

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed trailing slash: " << s << "\n";

  s.erase(std::unique(s.begin(), s.end(), [](char a, char b){ return a == '/' && b == '/'; }), s.end());

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed duplicated internal slashes: " << s << "\n";

  return s;
}